

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Static_Bit_Model *M)

{
  uint uVar1;
  uint uVar2;
  uint bit;
  uint x;
  Static_Bit_Model *M_local;
  Arithmetic_Codec *this_local;
  
  uVar2 = M->bit_0_prob * (this->length >> 0xd);
  uVar1 = (uint)(uVar2 <= this->value);
  if (uVar1 == 0) {
    this->length = uVar2;
  }
  else {
    this->value = this->value - uVar2;
    this->length = this->length - uVar2;
  }
  if (this->length < 0x1000000) {
    renorm_dec_interval(this);
  }
  return uVar1;
}

Assistant:

unsigned Arithmetic_Codec::decode(Static_Bit_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned x = M.bit_0_prob * (length >> BM__LengthShift);   // product l x p0
      unsigned bit = (value >= x);                                     // decision
                                                        // update & shift interval
      if (bit == 0)
        length  = x;
      else {
        value  -= x;                                 // shifted interval base = 0
        length -= x;
      }

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return bit;                                         // return data bit value
    }